

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface.cpp
# Opt level: O0

void __thiscall
QNetworkAddressEntry::setNetmask(QNetworkAddressEntry *this,QHostAddress *newNetmask)

{
  long lVar1;
  NetworkLayerProtocol NVar2;
  NetworkLayerProtocol NVar3;
  pointer pQVar4;
  QNetworkAddressEntry *in_RSI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffe8;
  QNetmask in_stack_ffffffffffffffef;
  QNetmask *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  NVar2 = QHostAddress::protocol((QHostAddress *)0x23e903);
  ip(in_RSI);
  NVar3 = QHostAddress::protocol((QHostAddress *)0x23e91f);
  QHostAddress::~QHostAddress((QHostAddress *)0x23e92d);
  if (NVar2 == NVar3) {
    std::unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
    ::operator->((unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                  *)0x23e95e);
    QNetmask::setAddress
              (in_stack_fffffffffffffff0,
               (QHostAddress *)CONCAT17(in_stack_ffffffffffffffef.length,in_stack_ffffffffffffffe8))
    ;
  }
  else {
    QNetmask::QNetmask((QNetmask *)&stack0xffffffffffffffef);
    pQVar4 = std::
             unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
             ::operator->((unique_ptr<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
                           *)0x23e94c);
    (pQVar4->netmask).length = in_stack_ffffffffffffffef.length;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAddressEntry::setNetmask(const QHostAddress &newNetmask)
{
    if (newNetmask.protocol() != ip().protocol()) {
        d->netmask = QNetmask();
        return;
    }

    d->netmask.setAddress(newNetmask);
}